

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<int_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<int_const&> *this,char *rhs)

{
  char cVar1;
  int iVar2;
  lest *this_00;
  char *in_R8;
  allocator<char> local_71;
  string local_70;
  string local_50 [32];
  
  this_00 = *(lest **)this;
  iVar2 = *(int *)this_00;
  cVar1 = *rhs;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"==",&local_71);
  to_string<int,char>(&local_70,this_00,(int *)local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = iVar2 == cVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result{ lhs <= rhs, to_string( lhs, "<=", rhs ) }; }